

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

BindDirectiveSyntax * __thiscall
slang::parsing::Parser::parseBindDirective(Parser *this,AttrList attr)

{
  bool bVar1;
  int iVar2;
  SyntaxNode *this_00;
  NameSyntax *pNVar3;
  undefined4 extraout_var;
  BindTargetListSyntax *targetInstances;
  HierarchyInstantiationSyntax *instantiation;
  BindDirectiveSyntax *pBVar4;
  __extent_storage<18446744073709551615UL> _Var5;
  EVP_PKEY_CTX *src;
  Token bind;
  SourceRange range;
  Token TVar6;
  EVP_PKEY_CTX *local_e8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e0;
  long local_d0;
  undefined8 uStack_c8;
  undefined8 local_b8;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> names;
  
  _Var5 = attr._M_extent._M_extent_value;
  bind = ParserBase::consume(&this->super_ParserBase);
  this_00 = (SyntaxNode *)parseName(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Colon);
  if (bVar1) {
    if (this_00->kind != IdentifierName) {
      range = slang::syntax::SyntaxNode::sourceRange(this_00);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x30005,range);
    }
    TVar6 = ParserBase::consume(&this->super_ParserBase);
    names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
    names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
    names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
    while( true ) {
      local_e8 = TVar6._0_8_;
      pNVar3 = parseName(this);
      local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar3;
      local_d0._0_1_ = 1;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_e0._M_first);
      bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
      if (!bVar1) break;
      local_e0._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase)
      ;
      local_d0 = (ulong)local_d0._1_7_ << 8;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_e0._M_first);
    }
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (&names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
    local_b8 = CONCAT44(extraout_var,iVar2);
    local_e0._8_4_ = 3;
    local_d0 = 0;
    uStack_c8 = 0;
    local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005964b8;
    targetInstances =
         slang::syntax::SyntaxFactory::bindTargetList
                   (&this->factory,TVar6,
                    (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&local_e0._M_first);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
              (&names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,local_e8);
  }
  else {
    targetInstances = (BindTargetListSyntax *)0x0;
  }
  (this->meta).hasBindDirectives = true;
  bVar1 = ParserBase::peek(&this->super_ParserBase,Identifier);
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._8_8_ =
       _Var5._M_extent_value;
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._16_8_ = attr._M_ptr;
  names.stackBase._0_8_ = _Var5._M_extent_value;
  if (bVar1) {
    TVar6 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar6.kind == DoubleColon) {
      TVar6 = ParserBase::peek(&this->super_ParserBase,2);
      if (TVar6.kind == Identifier) {
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len =
             CONCAT44(names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._4_4_,1);
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
        names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
             (pointer)&PTR_getChild_00593670;
        instantiation =
             (HierarchyInstantiationSyntax *)parseCheckerInstantiation(this,(AttrList)ZEXT816(0));
        goto LAB_00359fa1;
      }
    }
  }
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len =
       CONCAT44(names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._4_4_,1);
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
  names.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)&PTR_getChild_00593670;
  instantiation = parseHierarchyInstantiation(this,(AttrList)ZEXT816(0));
LAB_00359fa1:
  pBVar4 = slang::syntax::SyntaxFactory::bindDirective
                     (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&names,
                      bind,(NameSyntax *)this_00,targetInstances,&instantiation->super_MemberSyntax)
  ;
  return pBVar4;
}

Assistant:

BindDirectiveSyntax& Parser::parseBindDirective(AttrList attr) {
    Token keyword = consume();
    auto& target = parseName();

    BindTargetListSyntax* targetInstances = nullptr;
    if (peek(TokenKind::Colon)) {
        if (target.kind != SyntaxKind::IdentifierName)
            addDiag(diag::BindDirectiveInvalidName, target.sourceRange());

        auto colon = consume();

        SmallVector<TokenOrSyntax, 4> names;
        while (true) {
            names.push_back(&parseName());
            if (!peek(TokenKind::Comma))
                break;

            names.push_back(consume());
        }

        targetInstances = &factory.bindTargetList(colon, names.copy(alloc));
    }

    meta.hasBindDirectives = true;

    if (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::DoubleColon &&
        peek(2).kind == TokenKind::Identifier) {
        return factory.bindDirective(attr, keyword, target, targetInstances,
                                     parseCheckerInstantiation({}));
    }
    else {
        return factory.bindDirective(attr, keyword, target, targetInstances,
                                     parseHierarchyInstantiation({}));
    }
}